

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_3::DBIter::ClearSavedValue(DBIter *this)

{
  ulong uVar1;
  undefined1 local_30 [8];
  string empty;
  DBIter *this_local;
  
  empty.field_2._8_8_ = this;
  uVar1 = std::__cxx11::string::capacity();
  if (uVar1 < 0x100001) {
    std::__cxx11::string::clear();
  }
  else {
    std::__cxx11::string::string((string *)local_30);
    std::swap<char,std::char_traits<char>,std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
               &this->saved_value_);
    std::__cxx11::string::~string((string *)local_30);
  }
  return;
}

Assistant:

inline void ClearSavedValue() {
    if (saved_value_.capacity() > 1048576) {
      std::string empty;
      swap(empty, saved_value_);
    } else {
      saved_value_.clear();
    }
  }